

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O1

void __thiscall miniros::TransportPublisherLink::drop(TransportPublisherLink *this)

{
  int iVar1;
  Subscription *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  PublisherLinkPtr PStack_28;
  
  this->dropping_ = true;
  Connection::drop((this->connection_).
                   super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   Destructing);
  this_01 = (this->super_PublisherLink).parent_.
            super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_01->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar3 = iVar2 == iVar1;
      if (bVar3) {
        this_01->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar3);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = this_01->_M_use_count == 0;
  }
  this_00 = (this->super_PublisherLink).parent_.
            super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(this_00 == (Subscription *)0x0 | bVar3)) {
    std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::PublisherLink,void>
              ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&PStack_28,
               (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_PublisherLink).super_enable_shared_from_this<miniros::PublisherLink>);
    Subscription::removePublisherLink(this_00,&PStack_28);
    if (PStack_28.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (PStack_28.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void TransportPublisherLink::drop()
{
  dropping_ = true;
  connection_->drop(Connection::Destructing);

  if (SubscriptionPtr parent = parent_.lock())
  {
    parent->removePublisherLink(shared_from_this());
  }
}